

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

PaUtilAllocationGroupLink *
AllocateLinks(long count,PaUtilAllocationGroupLink *nextBlock,PaUtilAllocationGroupLink *nextSpare)

{
  PaUtilAllocationGroupLink *pPVar1;
  PaUtilAllocationGroupLink *in_RDX;
  PaUtilAllocationGroupLink *in_RSI;
  long in_RDI;
  int i;
  PaUtilAllocationGroupLink *result;
  int local_24;
  long in_stack_ffffffffffffffe0;
  
  pPVar1 = (PaUtilAllocationGroupLink *)PaUtil_AllocateMemory(in_stack_ffffffffffffffe0);
  if (pPVar1 != (PaUtilAllocationGroupLink *)0x0) {
    pPVar1->buffer = pPVar1;
    pPVar1->next = in_RSI;
    for (local_24 = 1; local_24 < in_RDI; local_24 = local_24 + 1) {
      pPVar1[local_24].buffer = (void *)0x0;
      pPVar1[local_24].next = pPVar1 + (local_24 + 1);
    }
    pPVar1[in_RDI + -1].next = in_RDX;
  }
  return pPVar1;
}

Assistant:

static struct PaUtilAllocationGroupLink *AllocateLinks( long count,
        struct PaUtilAllocationGroupLink *nextBlock,
        struct PaUtilAllocationGroupLink *nextSpare )
{
    struct PaUtilAllocationGroupLink *result;
    int i;
    
    result = (struct PaUtilAllocationGroupLink *)PaUtil_AllocateMemory(
            sizeof(struct PaUtilAllocationGroupLink) * count );
    if( result )
    {
        /* the block link */
        result[0].buffer = result;
        result[0].next = nextBlock;

        /* the spare links */
        for( i=1; i<count; ++i )
        {
            result[i].buffer = 0;
            result[i].next = &result[i+1];
        }
        result[count-1].next = nextSpare;
    }
    
    return result;
}